

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_set_properties(OPEN_HANDLE open,fields properties_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE properties_amqp_value;
  OPEN_INSTANCE *open_instance;
  int result;
  fields properties_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x877;
  }
  else {
    item_value = amqpvalue_create_fields(properties_value);
    if (item_value == (AMQP_VALUE)0x0) {
      open_instance._4_4_ = 0x87f;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,9,item_value);
      if (iVar1 == 0) {
        open_instance._4_4_ = 0;
      }
      else {
        open_instance._4_4_ = 0x885;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_set_properties(OPEN_HANDLE open, fields properties_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE properties_amqp_value = amqpvalue_create_fields(properties_value);
        if (properties_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 9, properties_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(properties_amqp_value);
        }
    }

    return result;
}